

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrent_sequence.cpp
# Opt level: O2

void append_values_from_sequence(ConcurrentData *data)

{
  pointer pMVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int64_t res;
  long *local_98;
  Connection con;
  string local_70 [64];
  
  duckdb::Connection::Connection(&con,data->db);
  lVar3 = 100;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    std::__cxx11::string::string(local_70,"SELECT nextval(\'seq\')",(allocator *)&res);
    duckdb::Connection::Query((string *)&local_98);
    std::__cxx11::string::~string(local_70);
    pMVar1 = duckdb::
             unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                           *)&local_98);
    duckdb::MaterializedQueryResult::GetValue((ulong)local_70,(ulong)pMVar1);
    lVar2 = duckdb::Value::GetValue<long>();
    duckdb::Value::~Value((Value *)local_70);
    res = lVar2;
    std::mutex::lock(&data->lock);
    std::vector<long,_std::allocator<long>_>::push_back
              (&(data->results).super_vector<long,_std::allocator<long>_>,&res);
    pthread_mutex_unlock((pthread_mutex_t *)&data->lock);
    if (local_98 != (long *)0x0) {
      (**(code **)(*local_98 + 8))();
    }
  }
  duckdb::Connection::~Connection(&con);
  return;
}

Assistant:

static void append_values_from_sequence(ConcurrentData *data) {
	Connection con(data->db);
	for (size_t i = 0; i < CONCURRENT_SEQUENCE_INSERT_COUNT; i++) {
		auto result = con.Query("SELECT nextval('seq')");
		int64_t res = result->GetValue(0, 0).GetValue<int64_t>();
		lock_guard<mutex> lock(data->lock);
		data->results.push_back(res);
	}
}